

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * QString::trimmed_helper(QString *__return_storage_ptr__,QString *str)

{
  QChar *__dest;
  long lVar1;
  Data *pDVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  QChar *unicode;
  QChar *pQVar5;
  TrimPositions TVar6;
  
  TVar6 = QStringAlgorithms<QString>::trimmed_helper_positions(str);
  pQVar5 = TVar6.end;
  unicode = TVar6.begin;
  __dest = (QChar *)(str->d).ptr;
  if ((unicode == __dest) && (lVar1 = (str->d).size, pQVar5 == __dest + lVar1)) {
    pDVar2 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (char16_t *)__dest;
    (__return_storage_ptr__->d).size = lVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pDVar2 = (str->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      QString(__return_storage_ptr__,unicode,(long)pQVar5 - (long)unicode >> 1);
    }
    else {
      if (unicode != __dest) {
        memmove(__dest,unicode,(long)pQVar5 - (long)unicode);
      }
      resize(str,(long)pQVar5 - (long)unicode >> 1);
      pDVar2 = (str->d).d;
      pcVar4 = (str->d).ptr;
      (str->d).d = (Data *)0x0;
      (str->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pcVar4;
      qVar3 = (str->d).size;
      (str->d).size = 0;
      (__return_storage_ptr__->d).size = qVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::trimmed_helper(QString &str)
{
    return QStringAlgorithms<QString>::trimmed_helper(str);
}